

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O1

bool __thiscall mylanguage_driver::parse_file(mylanguage_driver *this,cstref filename,ostream *out)

{
  bool bVar1;
  ostream *in_RCX;
  long local_228;
  ifstream in;
  int aiStack_208 [122];
  
  std::ifstream::ifstream(&local_228,(string *)filename,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
    bVar1 = parse_stream(this,(istream *)&local_228,filename,in_RCX);
  }
  else {
    bVar1 = false;
  }
  std::ifstream::~ifstream(&local_228);
  return bVar1;
}

Assistant:

bool mylanguage_driver::parse_file(cstref filename, std::ostream& out)
{
    ifstream in(filename);
    if(!in.good()) return false;
    return parse_stream(in, filename);
}